

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

RuntimeID __thiscall Jinx::Variant::GetFunction(Variant *this)

{
  bool bVar1;
  double dVar2;
  Variant v;
  
  if (this->m_type == Function) {
    dVar2 = (this->field_1).m_number;
  }
  else {
    Copy(&v,this);
    bVar1 = ConvertTo(&v,Function);
    if (bVar1) {
      dVar2 = (double)GetFunction(&v);
    }
    else {
      dVar2 = 0.0;
    }
    Destroy(&v);
  }
  return (RuntimeID)dVar2;
}

Assistant:

inline_t RuntimeID Variant::GetFunction() const
	{
		if (IsFunction())
			return m_function;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Function))
			return InvalidID;
		return v.GetFunction();
	}